

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unixmake.cpp
# Opt level: O0

QStringList * __thiscall
UnixMakefileGenerator::findDependencies(UnixMakefileGenerator *this,QString *f)

{
  bool bVar1;
  byte bVar2;
  uint uVar3;
  QStringList *pQVar4;
  iterator o;
  ProString *pPVar5;
  long *in_RDI;
  long in_FS_OFFSET;
  ProString *arch_1;
  add_const_t<ProStringList> *__range5;
  ProString *extension;
  ProStringList *__range4;
  ProString *compiler;
  ProStringList *__range3_1;
  ProString *arch;
  add_const_t<ProStringList> *__range3;
  QStringList *ret;
  QString precompiledHeader;
  const_iterator __end5;
  const_iterator __begin5;
  ProStringList pchArchs_1;
  iterator __end4;
  iterator __begin4;
  ProString extensionSuffix;
  ProString language;
  iterator __end3_1;
  iterator __begin3_1;
  QString header_suffix;
  Iterator it;
  QString pfx;
  const_iterator __end3;
  const_iterator __begin3;
  ProStringList pchArchs;
  QString header_prefix;
  ProString file;
  ProString *in_stack_fffffffffffff7b8;
  undefined4 in_stack_fffffffffffff7c0;
  CaseSensitivity in_stack_fffffffffffff7c4;
  QMakeProject *in_stack_fffffffffffff7c8;
  undefined7 in_stack_fffffffffffff7d0;
  byte in_stack_fffffffffffff7d7;
  QMakeProject *in_stack_fffffffffffff7d8;
  ProString *in_stack_fffffffffffff7e0;
  MakefileGenerator *in_stack_fffffffffffff7e8;
  QString *in_stack_fffffffffffff7f0;
  undefined7 in_stack_fffffffffffff7f8;
  undefined1 in_stack_fffffffffffff7ff;
  byte local_781;
  CaseSensitivity local_75c;
  QString *local_6f0;
  CaseSensitivity local_6e8;
  undefined8 local_6b8;
  undefined8 local_6b0;
  undefined8 local_6a8;
  ProString *local_6a0;
  const_iterator local_698;
  const_iterator local_690 [13];
  undefined8 local_628;
  undefined8 local_620;
  undefined8 local_618;
  ProString *local_5f8;
  iterator local_5f0;
  iterator local_5e8;
  QStringBuilder<const_char_(&)[11],_ProString_&> local_5e0;
  undefined1 local_570 [48];
  QStringBuilder<const_char_(&)[16],_const_ProString_&> local_540;
  ProString local_500;
  QStringBuilder<const_char_(&)[7],_const_ProString_&> local_4d0;
  ProString *local_478;
  iterator local_470;
  iterator local_468 [41];
  undefined8 local_320;
  undefined8 local_318;
  undefined8 local_310;
  iterator local_308 [4];
  QString *local_2e8;
  undefined8 local_2e0;
  undefined8 local_2d8;
  undefined8 local_2d0;
  undefined8 local_2c8;
  ProString *local_2c0;
  const_iterator local_2b8;
  const_iterator local_2b0 [13];
  undefined8 local_248;
  undefined8 local_240;
  undefined8 local_238;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined1 local_68 [96];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = MakefileGenerator::findDependencies
                     (in_stack_fffffffffffff7e8,&in_stack_fffffffffffff7e0->m_string);
  uVar3 = (**(code **)(*in_RDI + 0x108))();
  local_781 = 0;
  local_75c = in_stack_fffffffffffff7c4;
  if ((uVar3 & 1) != 0) {
    ProKey::ProKey((ProKey *)CONCAT44(in_stack_fffffffffffff7c4,in_stack_fffffffffffff7c0),
                   (char *)in_stack_fffffffffffff7b8);
    bVar1 = QMakeProject::isEmpty
                      (in_stack_fffffffffffff7d8,
                       (ProKey *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
    local_781 = bVar1 ^ 0xff;
    ProKey::~ProKey((ProKey *)0x1f1af6);
    local_75c = in_stack_fffffffffffff7c4;
  }
  if ((local_781 & 1) != 0) {
    memset(local_68,0xaa,0x30);
    ProString::ProString
              ((ProString *)CONCAT44(local_75c,in_stack_fffffffffffff7c0),
               &in_stack_fffffffffffff7b8->m_string);
    local_80 = 0xaaaaaaaaaaaaaaaa;
    local_78 = 0xaaaaaaaaaaaaaaaa;
    local_70 = 0xaaaaaaaaaaaaaaaa;
    QString::QString((QString *)0x1f1b6c);
    ProKey::ProKey((ProKey *)CONCAT44(local_75c,in_stack_fffffffffffff7c0),
                   (char *)in_stack_fffffffffffff7b8);
    bVar1 = QMakeProject::isEmpty
                      (in_stack_fffffffffffff7d8,
                       (ProKey *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
    ProKey::~ProKey((ProKey *)0x1f1bc2);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ProKey::ProKey((ProKey *)CONCAT44(local_75c,in_stack_fffffffffffff7c0),
                     (char *)in_stack_fffffffffffff7b8);
      QMakeEvaluator::first
                (&in_stack_fffffffffffff7d8->super_QMakeEvaluator,
                 (ProKey *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
      ProString::toQString(in_stack_fffffffffffff7b8);
      QString::operator=((QString *)CONCAT44(local_75c,in_stack_fffffffffffff7c0),
                         &in_stack_fffffffffffff7b8->m_string);
      QString::~QString((QString *)0x1f1c51);
      ProString::~ProString((ProString *)0x1f1c5e);
      ProKey::~ProKey((ProKey *)0x1f1c6b);
    }
    ProKey::ProKey((ProKey *)CONCAT44(local_75c,in_stack_fffffffffffff7c0),
                   (char *)in_stack_fffffffffffff7b8);
    QMakeEvaluator::first
              (&in_stack_fffffffffffff7d8->super_QMakeEvaluator,
               (ProKey *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
    ProString::toQString(in_stack_fffffffffffff7b8);
    QString::operator+=((QString *)CONCAT44(local_75c,in_stack_fffffffffffff7c0),
                        &in_stack_fffffffffffff7b8->m_string);
    QString::~QString((QString *)0x1f1ce4);
    ProString::~ProString((ProString *)0x1f1cf1);
    ProKey::~ProKey((ProKey *)0x1f1cfe);
    ProKey::ProKey((ProKey *)CONCAT44(local_75c,in_stack_fffffffffffff7c0),
                   (char *)in_stack_fffffffffffff7b8);
    QMakeEvaluator::first
              (&in_stack_fffffffffffff7d8->super_QMakeEvaluator,
               (ProKey *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
    ProString::toQString(in_stack_fffffffffffff7b8);
    QString::operator+=((QString *)CONCAT44(local_75c,in_stack_fffffffffffff7c0),
                        &in_stack_fffffffffffff7b8->m_string);
    QString::~QString((QString *)0x1f1d7d);
    ProString::~ProString((ProString *)0x1f1d8a);
    ProKey::~ProKey((ProKey *)0x1f1d97);
    QString::QString((QString *)in_stack_fffffffffffff7c8,
                     (char *)CONCAT17(in_stack_fffffffffffff7ff,in_stack_fffffffffffff7f8));
    bVar1 = QMakeProject::isActiveConfig
                      (in_stack_fffffffffffff7c8,
                       (QString *)CONCAT44(local_75c,in_stack_fffffffffffff7c0),
                       SUB81((ulong)in_stack_fffffffffffff7b8 >> 0x38,0));
    QString::~QString((QString *)0x1f1ded);
    if (bVar1) {
      local_248 = 0xaaaaaaaaaaaaaaaa;
      local_240 = 0xaaaaaaaaaaaaaaaa;
      local_238 = 0xaaaaaaaaaaaaaaaa;
      ProKey::ProKey((ProKey *)CONCAT44(local_75c,in_stack_fffffffffffff7c0),
                     (char *)in_stack_fffffffffffff7b8);
      QMakeProject::values
                ((QMakeProject *)CONCAT44(local_75c,in_stack_fffffffffffff7c0),
                 (ProKey *)in_stack_fffffffffffff7b8);
      ProStringList::ProStringList
                ((ProStringList *)CONCAT44(local_75c,in_stack_fffffffffffff7c0),
                 (ProStringList *)in_stack_fffffffffffff7b8);
      ProKey::~ProKey((ProKey *)0x1f1e81);
      bVar1 = QList<ProString>::isEmpty((QList<ProString> *)0x1f1e8e);
      if (bVar1) {
        ProString::ProString((ProString *)CONCAT44(local_75c,in_stack_fffffffffffff7c0));
        ProStringList::operator<<
                  ((ProStringList *)CONCAT44(local_75c,in_stack_fffffffffffff7c0),
                   in_stack_fffffffffffff7b8);
        ProString::~ProString((ProString *)0x1f1ec3);
      }
      local_2b0[0].i = (ProString *)0xaaaaaaaaaaaaaaaa;
      local_2b0[0] = QList<ProString>::begin
                               ((QList<ProString> *)CONCAT44(local_75c,in_stack_fffffffffffff7c0));
      local_2b8.i = (ProString *)0xaaaaaaaaaaaaaaaa;
      local_2b8 = QList<ProString>::end
                            ((QList<ProString> *)CONCAT44(local_75c,in_stack_fffffffffffff7c0));
      while( true ) {
        local_2c0 = local_2b8.i;
        bVar1 = QList<ProString>::const_iterator::operator!=(local_2b0,local_2b8);
        if (!bVar1) break;
        pPVar5 = QList<ProString>::const_iterator::operator*(local_2b0);
        local_2d8 = 0xaaaaaaaaaaaaaaaa;
        local_2d0 = 0xaaaaaaaaaaaaaaaa;
        local_2c8 = 0xaaaaaaaaaaaaaaaa;
        QString::QString((QString *)CONCAT44(local_75c,in_stack_fffffffffffff7c0),
                         &in_stack_fffffffffffff7b8->m_string);
        bVar1 = ProString::isEmpty(pPVar5);
        if (!bVar1) {
          QLatin1String::QLatin1String
                    ((QLatin1String *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0),
                     (char *)in_stack_fffffffffffff7c8);
          ProString::toQString(in_stack_fffffffffffff7b8);
          QString::replace((QLatin1String *)&local_2d8,local_2e8,(CaseSensitivity)local_2e0);
          QString::~QString((QString *)0x1f2036);
        }
        local_308[0].i = (QString *)0xaaaaaaaaaaaaaaaa;
        local_308[0] = QList<QString>::begin
                                 ((QList<QString> *)CONCAT44(local_75c,in_stack_fffffffffffff7c0));
        while( true ) {
          o = QList<QString>::end((QList<QString> *)CONCAT44(local_75c,in_stack_fffffffffffff7c0));
          bVar1 = QList<QString>::iterator::operator!=(local_308,o);
          if (!bVar1) break;
          QList<QString>::iterator::operator*(local_308);
          bVar1 = ProString::endsWith((ProString *)
                                      CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0),
                                      (QString *)in_stack_fffffffffffff7c8,local_75c);
          if (bVar1) {
            QList<QString>::operator+=
                      ((QList<QString> *)CONCAT44(local_75c,in_stack_fffffffffffff7c0),
                       &in_stack_fffffffffffff7b8->m_string);
            break;
          }
          QList<QString>::iterator::operator++(local_308);
        }
        QString::~QString((QString *)0x1f20e5);
        QList<ProString>::const_iterator::operator++(local_2b0);
      }
      ProStringList::~ProStringList((ProStringList *)0x1f2104);
    }
    else {
      local_320 = 0xaaaaaaaaaaaaaaaa;
      local_318 = 0xaaaaaaaaaaaaaaaa;
      local_310 = 0xaaaaaaaaaaaaaaaa;
      QString::QString((QString *)in_stack_fffffffffffff7c8,
                       (char *)CONCAT17(in_stack_fffffffffffff7ff,in_stack_fffffffffffff7f8));
      bVar1 = QMakeProject::isActiveConfig
                        (in_stack_fffffffffffff7c8,
                         (QString *)CONCAT44(local_75c,in_stack_fffffffffffff7c0),
                         SUB81((ulong)in_stack_fffffffffffff7b8 >> 0x38,0));
      if (bVar1) {
        ProKey::ProKey((ProKey *)CONCAT44(local_75c,in_stack_fffffffffffff7c0),
                       (char *)in_stack_fffffffffffff7b8);
        QMakeEvaluator::first
                  (&in_stack_fffffffffffff7d8->super_QMakeEvaluator,
                   (ProKey *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
        ProString::toQString(in_stack_fffffffffffff7b8);
        ProString::~ProString((ProString *)0x1f221e);
        ProKey::~ProKey((ProKey *)0x1f2237);
      }
      else {
        QString::QString((QString *)in_stack_fffffffffffff7c8,
                         (char *)CONCAT17(in_stack_fffffffffffff7ff,in_stack_fffffffffffff7f8));
      }
      QString::~QString((QString *)0x1f2244);
      ProKey::ProKey((ProKey *)CONCAT44(local_75c,in_stack_fffffffffffff7c0),
                     (char *)in_stack_fffffffffffff7b8);
      QMakeEvaluator::first
                (&in_stack_fffffffffffff7d8->super_QMakeEvaluator,
                 (ProKey *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
      ::operator+((QString *)in_stack_fffffffffffff7c8,
                  (ProString *)CONCAT44(local_75c,in_stack_fffffffffffff7c0));
      ::operator+=(in_stack_fffffffffffff7f0,
                   (QStringBuilder<QString_&,_ProString> *)in_stack_fffffffffffff7e8);
      QStringBuilder<QString_&,_ProString>::~QStringBuilder
                ((QStringBuilder<QString_&,_ProString> *)0x1f22c4);
      ProString::~ProString((ProString *)0x1f22d1);
      ProKey::~ProKey((ProKey *)0x1f22de);
      ProKey::ProKey((ProKey *)CONCAT44(local_75c,in_stack_fffffffffffff7c0),
                     (char *)in_stack_fffffffffffff7b8);
      QMakeProject::values
                ((QMakeProject *)CONCAT44(local_75c,in_stack_fffffffffffff7c0),
                 (ProKey *)in_stack_fffffffffffff7b8);
      ProKey::~ProKey((ProKey *)0x1f233c);
      local_468[0].i = (ProString *)0xaaaaaaaaaaaaaaaa;
      local_468[0] = QList<ProString>::begin
                               ((QList<ProString> *)CONCAT44(local_75c,in_stack_fffffffffffff7c0));
      local_470.i = (ProString *)0xaaaaaaaaaaaaaaaa;
      local_470 = QList<ProString>::end
                            ((QList<ProString> *)CONCAT44(local_75c,in_stack_fffffffffffff7c0));
      while( true ) {
        local_478 = local_470.i;
        bVar1 = QList<ProString>::iterator::operator!=(local_468,local_470);
        if (!bVar1) break;
        QList<ProString>::iterator::operator*(local_468);
        local_4d0 = ::operator+((char (*) [7])CONCAT44(local_75c,in_stack_fffffffffffff7c0),
                                in_stack_fffffffffffff7b8);
        ::operator+((QStringBuilder<const_char_(&)[7],_const_ProString_&> *)
                    CONCAT44(local_75c,in_stack_fffffffffffff7c0),
                    (char (*) [17])in_stack_fffffffffffff7b8);
        ProKey::ProKey<QStringBuilder<char_const(&)[7],ProString_const&>,char_const(&)[17]>
                  ((ProKey *)CONCAT44(local_75c,in_stack_fffffffffffff7c0),
                   (QStringBuilder<QStringBuilder<const_char_(&)[7],_const_ProString_&>,_const_char_(&)[17]>
                    *)in_stack_fffffffffffff7b8);
        bVar2 = QMakeProject::isEmpty
                          (in_stack_fffffffffffff7d8,
                           (ProKey *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
        ProKey::~ProKey((ProKey *)0x1f2475);
        if ((bVar2 & 1) == 0) {
          memset(&local_500,0xaa,0x30);
          local_540 = ::operator+((char (*) [16])CONCAT44(local_75c,in_stack_fffffffffffff7c0),
                                  in_stack_fffffffffffff7b8);
          ProKey::ProKey<char_const(&)[16],ProString_const&>
                    ((ProKey *)CONCAT44(local_75c,in_stack_fffffffffffff7c0),
                     (QStringBuilder<const_char_(&)[16],_const_ProString_&> *)
                     in_stack_fffffffffffff7b8);
          QMakeEvaluator::first
                    (&in_stack_fffffffffffff7d8->super_QMakeEvaluator,
                     (ProKey *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
          ProKey::~ProKey((ProKey *)0x1f250f);
          bVar1 = ProString::isEmpty(&local_500);
          if (bVar1) {
            local_75c = 8;
          }
          else {
            memset(local_570,0xaa,0x30);
            ProString::ProString
                      ((ProString *)CONCAT44(local_75c,in_stack_fffffffffffff7c0),
                       in_stack_fffffffffffff7b8);
            bVar1 = ProString::operator==
                              (in_stack_fffffffffffff7e0,(char *)in_stack_fffffffffffff7d8);
            if (bVar1) {
              ProString::ProString
                        ((ProString *)CONCAT44(local_75c,in_stack_fffffffffffff7c0),
                         (char *)in_stack_fffffffffffff7d8);
              ProString::operator=
                        ((ProString *)CONCAT44(local_75c,in_stack_fffffffffffff7c0),
                         in_stack_fffffffffffff7b8);
              ProString::~ProString((ProString *)0x1f25ae);
            }
            in_stack_fffffffffffff7d8 = (QMakeProject *)in_RDI[0x1b];
            local_5e0 = ::operator+((char (*) [11])CONCAT44(local_75c,in_stack_fffffffffffff7c0),
                                    in_stack_fffffffffffff7b8);
            ProKey::ProKey<char_const(&)[11],ProString&>
                      ((ProKey *)CONCAT44(local_75c,in_stack_fffffffffffff7c0),
                       (QStringBuilder<const_char_(&)[11],_ProString_&> *)in_stack_fffffffffffff7b8)
            ;
            in_stack_fffffffffffff7e0 =
                 (ProString *)
                 QMakeProject::values
                           ((QMakeProject *)CONCAT44(local_75c,in_stack_fffffffffffff7c0),
                            (ProKey *)in_stack_fffffffffffff7b8);
            ProKey::~ProKey((ProKey *)0x1f2631);
            local_5e8.i = (ProString *)0xaaaaaaaaaaaaaaaa;
            local_5e8 = QList<ProString>::begin
                                  ((QList<ProString> *)CONCAT44(local_75c,in_stack_fffffffffffff7c0)
                                  );
            local_5f0.i = (ProString *)0xaaaaaaaaaaaaaaaa;
            local_5f0 = QList<ProString>::end
                                  ((QList<ProString> *)CONCAT44(local_75c,in_stack_fffffffffffff7c0)
                                  );
LAB_001f2686:
            local_5f8 = local_5f0.i;
            bVar1 = QList<ProString>::iterator::operator!=(&local_5e8,local_5f0);
            if (bVar1) {
              QList<ProString>::iterator::operator*(&local_5e8);
              ProString::toQString(in_stack_fffffffffffff7b8);
              bVar1 = ProString::endsWith((ProString *)
                                          CONCAT17(in_stack_fffffffffffff7d7,
                                                   in_stack_fffffffffffff7d0),
                                          (QString *)in_stack_fffffffffffff7c8,local_75c);
              in_stack_fffffffffffff7d7 = bVar1 ^ 0xff;
              QString::~QString((QString *)0x1f271d);
              if ((in_stack_fffffffffffff7d7 & 1) != 0) goto LAB_001f2a13;
              local_628 = 0xaaaaaaaaaaaaaaaa;
              local_620 = 0xaaaaaaaaaaaaaaaa;
              local_618 = 0xaaaaaaaaaaaaaaaa;
              in_stack_fffffffffffff7c8 = (QMakeProject *)in_RDI[0x1b];
              ProKey::ProKey((ProKey *)CONCAT44(local_75c,in_stack_fffffffffffff7c0),
                             (char *)in_stack_fffffffffffff7b8);
              QMakeProject::values
                        ((QMakeProject *)CONCAT44(local_75c,in_stack_fffffffffffff7c0),
                         (ProKey *)in_stack_fffffffffffff7b8);
              ProStringList::ProStringList
                        ((ProStringList *)CONCAT44(local_75c,in_stack_fffffffffffff7c0),
                         (ProStringList *)in_stack_fffffffffffff7b8);
              ProKey::~ProKey((ProKey *)0x1f27b0);
              bVar1 = QList<ProString>::isEmpty((QList<ProString> *)0x1f27bd);
              if (bVar1) {
                ProString::ProString((ProString *)CONCAT44(local_75c,in_stack_fffffffffffff7c0));
                ProStringList::operator<<
                          ((ProStringList *)CONCAT44(local_75c,in_stack_fffffffffffff7c0),
                           in_stack_fffffffffffff7b8);
                ProString::~ProString((ProString *)0x1f27f2);
              }
              local_690[0].i = (ProString *)0xaaaaaaaaaaaaaaaa;
              local_690[0] = QList<ProString>::begin
                                       ((QList<ProString> *)
                                        CONCAT44(local_75c,in_stack_fffffffffffff7c0));
              local_698.i = (ProString *)0xaaaaaaaaaaaaaaaa;
              local_698 = QList<ProString>::end
                                    ((QList<ProString> *)
                                     CONCAT44(local_75c,in_stack_fffffffffffff7c0));
              while( true ) {
                local_6a0 = local_698.i;
                bVar1 = QList<ProString>::const_iterator::operator!=(local_690,local_698);
                if (!bVar1) break;
                pPVar5 = QList<ProString>::const_iterator::operator*(local_690);
                local_6b8 = 0xaaaaaaaaaaaaaaaa;
                local_6b0 = 0xaaaaaaaaaaaaaaaa;
                local_6a8 = 0xaaaaaaaaaaaaaaaa;
                ::operator+((QString *)CONCAT44(local_75c,in_stack_fffffffffffff7c0),
                            in_stack_fffffffffffff7b8);
                ::operator+((QStringBuilder<QString_&,_ProString_&> *)
                            CONCAT44(local_75c,in_stack_fffffffffffff7c0),
                            &in_stack_fffffffffffff7b8->m_string);
                ::QStringBuilder::operator_cast_to_QString
                          ((QStringBuilder<QStringBuilder<QString_&,_ProString_&>,_QString_&> *)
                           in_stack_fffffffffffff7b8);
                bVar1 = ProString::isEmpty(pPVar5);
                if (!bVar1) {
                  QLatin1String::QLatin1String
                            ((QLatin1String *)
                             CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0),
                             (char *)in_stack_fffffffffffff7c8);
                  ProString::toQString(in_stack_fffffffffffff7b8);
                  QString::replace((QLatin1String *)&local_6b8,local_6f0,local_6e8);
                  QString::~QString((QString *)0x1f29a7);
                }
                bVar1 = QListSpecialMethods<QString>::contains
                                  ((QListSpecialMethods<QString> *)in_stack_fffffffffffff7c8,
                                   (QString *)CONCAT44(local_75c,in_stack_fffffffffffff7c0),
                                   (CaseSensitivity)((ulong)in_stack_fffffffffffff7b8 >> 0x20));
                if (!bVar1) {
                  QList<QString>::operator+=
                            ((QList<QString> *)CONCAT44(local_75c,in_stack_fffffffffffff7c0),
                             &in_stack_fffffffffffff7b8->m_string);
                }
                QString::~QString((QString *)0x1f29e7);
                QList<ProString>::const_iterator::operator++(local_690);
              }
              local_75c = 0xd;
              ProStringList::~ProStringList((ProStringList *)0x1f2a11);
            }
            else {
              local_75c = CaseInsensitive;
            }
            ProString::~ProString((ProString *)0x1f2a3d);
          }
          ProString::~ProString((ProString *)0x1f2a4a);
          if ((local_75c != CaseInsensitive) && (local_75c != 8)) break;
        }
        QList<ProString>::iterator::operator++(local_468);
      }
      QString::~QString((QString *)0x1f2a8b);
    }
    QString::~QString((QString *)0x1f2a98);
    ProString::~ProString((ProString *)0x1f2aa5);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return pQVar4;
  }
  __stack_chk_fail();
LAB_001f2a13:
  QList<ProString>::iterator::operator++(&local_5e8);
  goto LAB_001f2686;
}

Assistant:

QStringList
&UnixMakefileGenerator::findDependencies(const QString &f)
{
    QStringList &ret = MakefileGenerator::findDependencies(f);
    if (doPrecompiledHeaders() && !project->isEmpty("PRECOMPILED_HEADER")) {
        ProString file = f;
        QString header_prefix;
        if(!project->isEmpty("PRECOMPILED_DIR"))
            header_prefix = project->first("PRECOMPILED_DIR").toQString();
        header_prefix += project->first("QMAKE_ORIG_TARGET").toQString();
        header_prefix += project->first("QMAKE_PCH_OUTPUT_EXT").toQString();
        if (project->isActiveConfig("icc_pch_style")) {
            // icc style
            ProStringList pchArchs = project->values("QMAKE_PCH_ARCHS");
            if (pchArchs.isEmpty())
                pchArchs << ProString(); // normal single-arch PCH
            for (const ProString &arch : std::as_const(pchArchs)) {
                auto pfx = header_prefix;
                if (!arch.isEmpty())
                    pfx.replace(QLatin1String("${QMAKE_PCH_ARCH}"), arch.toQString());
                for (QStringList::Iterator it = Option::cpp_ext.begin();
                    it != Option::cpp_ext.end(); ++it) {
                    if (file.endsWith(*it)) {
                        ret += pfx;
                        break;
                    }
                }
            }
        } else {
            // gcc style (including clang_pch_style)
            QString header_suffix = project->isActiveConfig("clang_pch_style")
                    ? project->first("QMAKE_PCH_OUTPUT_EXT").toQString() : "";
            header_prefix += Option::dir_sep + project->first("QMAKE_PRECOMP_PREFIX");

            for (const ProString &compiler : project->values("QMAKE_BUILTIN_COMPILERS")) {
                if (project->isEmpty(ProKey("QMAKE_" + compiler + "FLAGS_PRECOMPILE")))
                    continue;

                ProString language = project->first(ProKey("QMAKE_LANGUAGE_" + compiler));
                if (language.isEmpty())
                    continue;

                // Unfortunately we were not consistent about the C++ naming
                ProString extensionSuffix = compiler;
                if (extensionSuffix == "CXX")
                    extensionSuffix = ProString("CPP");

                for (const ProString &extension : project->values(ProKey("QMAKE_EXT_" + extensionSuffix))) {
                    if (!file.endsWith(extension.toQString()))
                        continue;

                    ProStringList pchArchs = project->values("QMAKE_PCH_ARCHS");
                    if (pchArchs.isEmpty())
                        pchArchs << ProString(); // normal single-arch PCH
                    for (const ProString &arch : std::as_const(pchArchs)) {
                        QString precompiledHeader = header_prefix + language + header_suffix;
                        if (!arch.isEmpty()) {
                            precompiledHeader.replace(QLatin1String("${QMAKE_PCH_ARCH}"),
                                                      arch.toQString());
                        }
                        if (!ret.contains(precompiledHeader))
                            ret += precompiledHeader;
                    }

                    goto foundPrecompiledDependency;
                }
            }
          foundPrecompiledDependency:
            ; // Hurray!!
        }
    }
    return ret;
}